

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

Optimizer * __thiscall
spvtools::Optimizer::RegisterPerformancePasses(Optimizer *this,bool preserve_interface)

{
  Optimizer *pOVar1;
  PassToken local_178;
  PassToken local_170;
  PassToken local_168;
  PassToken local_160;
  PassToken local_158;
  PassToken local_150;
  PassToken local_148;
  PassToken local_140;
  PassToken local_138;
  PassToken local_130;
  PassToken local_128;
  PassToken local_120;
  PassToken local_118;
  PassToken local_110;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  PassToken local_58;
  PassToken local_50;
  PassToken local_48;
  PassToken local_40;
  PassToken local_38;
  PassToken local_30;
  PassToken local_28;
  PassToken local_20;
  byte local_11;
  Optimizer *pOStack_10;
  bool preserve_interface_local;
  Optimizer *this_local;
  
  local_11 = preserve_interface;
  pOStack_10 = this;
  CreateWrapOpKillPass();
  pOVar1 = RegisterPass(this,&local_20);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_28);
  CreateMergeReturnPass();
  pOVar1 = RegisterPass(pOVar1,&local_30);
  CreateInlineExhaustivePass();
  pOVar1 = RegisterPass(pOVar1,&local_38);
  CreateEliminateDeadFunctionsPass();
  pOVar1 = RegisterPass(pOVar1,&local_40);
  CreateAggressiveDCEPass((spvtools *)&local_48,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_48);
  CreatePrivateToLocalPass();
  pOVar1 = RegisterPass(pOVar1,&local_50);
  CreateLocalSingleBlockLoadStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_58);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_60);
  CreateAggressiveDCEPass((spvtools *)&local_68,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_68);
  CreateScalarReplacementPass((spvtools *)&local_70,100);
  pOVar1 = RegisterPass(pOVar1,&local_70);
  CreateLocalAccessChainConvertPass();
  pOVar1 = RegisterPass(pOVar1,&local_78);
  CreateLocalSingleBlockLoadStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_80);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_88);
  CreateAggressiveDCEPass((spvtools *)&local_90,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_90);
  CreateLocalMultiStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_98);
  CreateAggressiveDCEPass((spvtools *)&local_a0,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_a0);
  CreateCCPPass();
  pOVar1 = RegisterPass(pOVar1,&local_a8);
  CreateAggressiveDCEPass((spvtools *)&local_b0,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_b0);
  CreateLoopUnrollPass((spvtools *)&local_b8,true,0);
  pOVar1 = RegisterPass(pOVar1,&local_b8);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_c0);
  CreateRedundancyEliminationPass();
  pOVar1 = RegisterPass(pOVar1,&local_c8);
  CreateCombineAccessChainsPass();
  pOVar1 = RegisterPass(pOVar1,&local_d0);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_d8);
  CreateScalarReplacementPass((spvtools *)&local_e0,100);
  pOVar1 = RegisterPass(pOVar1,&local_e0);
  CreateLocalAccessChainConvertPass();
  pOVar1 = RegisterPass(pOVar1,&local_e8);
  CreateLocalSingleBlockLoadStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_f0);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_f8);
  CreateAggressiveDCEPass((spvtools *)&local_100,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_100);
  CreateSSARewritePass();
  pOVar1 = RegisterPass(pOVar1,&local_108);
  CreateAggressiveDCEPass((spvtools *)&local_110,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_110);
  CreateVectorDCEPass();
  pOVar1 = RegisterPass(pOVar1,&local_118);
  CreateDeadInsertElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_120);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_128);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_130);
  CreateIfConversionPass();
  pOVar1 = RegisterPass(pOVar1,&local_138);
  CreateCopyPropagateArraysPass();
  pOVar1 = RegisterPass(pOVar1,&local_140);
  CreateReduceLoadSizePass((spvtools *)&local_148,0.9);
  pOVar1 = RegisterPass(pOVar1,&local_148);
  CreateAggressiveDCEPass((spvtools *)&local_150,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_150);
  CreateBlockMergePass();
  pOVar1 = RegisterPass(pOVar1,&local_158);
  CreateRedundancyEliminationPass();
  pOVar1 = RegisterPass(pOVar1,&local_160);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_168);
  CreateBlockMergePass();
  pOVar1 = RegisterPass(pOVar1,&local_170);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_178);
  PassToken::~PassToken(&local_178);
  PassToken::~PassToken(&local_170);
  PassToken::~PassToken(&local_168);
  PassToken::~PassToken(&local_160);
  PassToken::~PassToken(&local_158);
  PassToken::~PassToken(&local_150);
  PassToken::~PassToken(&local_148);
  PassToken::~PassToken(&local_140);
  PassToken::~PassToken(&local_138);
  PassToken::~PassToken(&local_130);
  PassToken::~PassToken(&local_128);
  PassToken::~PassToken(&local_120);
  PassToken::~PassToken(&local_118);
  PassToken::~PassToken(&local_110);
  PassToken::~PassToken(&local_108);
  PassToken::~PassToken(&local_100);
  PassToken::~PassToken(&local_f8);
  PassToken::~PassToken(&local_f0);
  PassToken::~PassToken(&local_e8);
  PassToken::~PassToken(&local_e0);
  PassToken::~PassToken(&local_d8);
  PassToken::~PassToken(&local_d0);
  PassToken::~PassToken(&local_c8);
  PassToken::~PassToken(&local_c0);
  PassToken::~PassToken(&local_b8);
  PassToken::~PassToken(&local_b0);
  PassToken::~PassToken(&local_a8);
  PassToken::~PassToken(&local_a0);
  PassToken::~PassToken(&local_98);
  PassToken::~PassToken(&local_90);
  PassToken::~PassToken(&local_88);
  PassToken::~PassToken(&local_80);
  PassToken::~PassToken(&local_78);
  PassToken::~PassToken(&local_70);
  PassToken::~PassToken(&local_68);
  PassToken::~PassToken(&local_60);
  PassToken::~PassToken(&local_58);
  PassToken::~PassToken(&local_50);
  PassToken::~PassToken(&local_48);
  PassToken::~PassToken(&local_40);
  PassToken::~PassToken(&local_38);
  PassToken::~PassToken(&local_30);
  PassToken::~PassToken(&local_28);
  PassToken::~PassToken(&local_20);
  return pOVar1;
}

Assistant:

Optimizer& Optimizer::RegisterPerformancePasses(bool preserve_interface) {
  return RegisterPass(CreateWrapOpKillPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateMergeReturnPass())
      .RegisterPass(CreateInlineExhaustivePass())
      .RegisterPass(CreateEliminateDeadFunctionsPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreatePrivateToLocalPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateScalarReplacementPass())
      .RegisterPass(CreateLocalAccessChainConvertPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateLocalMultiStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateCCPPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateLoopUnrollPass(true))
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateRedundancyEliminationPass())
      .RegisterPass(CreateCombineAccessChainsPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateScalarReplacementPass())
      .RegisterPass(CreateLocalAccessChainConvertPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateSSARewritePass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateVectorDCEPass())
      .RegisterPass(CreateDeadInsertElimPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateIfConversionPass())
      .RegisterPass(CreateCopyPropagateArraysPass())
      .RegisterPass(CreateReduceLoadSizePass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateRedundancyEliminationPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateSimplificationPass());
}